

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AutoincrementEnd(Parse *pParse)

{
  int iVar1;
  Vdbe *p_00;
  sqlite3 *psVar2;
  Db *pDVar3;
  int p3;
  int iVar4;
  int iVar5;
  int p2;
  int addr;
  int memId;
  int iRec;
  int j5;
  int j4;
  int j3;
  int j2;
  int j1;
  Db *pDb;
  sqlite3 *db;
  Vdbe *v;
  AutoincInfo *p;
  Parse *pParse_local;
  
  p_00 = pParse->pVdbe;
  psVar2 = pParse->db;
  for (v = (Vdbe *)pParse->pAinc; v != (Vdbe *)0x0; v = (Vdbe *)v->db) {
    pDVar3 = psVar2->aDb;
    iVar4 = *(int *)&v->aMem;
    iVar1 = *(int *)((long)&v->aMem + 4);
    p3 = sqlite3GetTempReg(pParse);
    sqlite3OpenTable(pParse,0,*(int *)&v->aMem,(pDVar3[iVar4].pSchema)->pSeqTab,0x28);
    iVar4 = sqlite3VdbeAddOp1(p_00,0x4a,iVar1 + 1);
    iVar5 = sqlite3VdbeAddOp0(p_00,0x48);
    p2 = sqlite3VdbeAddOp3(p_00,0x1d,0,0,p3);
    addr = sqlite3VdbeAddOp3(p_00,0x4c,iVar1 + -1,0,p3);
    sqlite3VdbeAddOp2(p_00,0x5f,0,p2);
    sqlite3VdbeJumpHere(p_00,iVar5);
    sqlite3VdbeAddOp2(p_00,0x38,0,iVar1 + 1);
    iVar5 = sqlite3VdbeAddOp0(p_00,1);
    sqlite3VdbeJumpHere(p_00,addr);
    sqlite3VdbeAddOp2(p_00,0x41,0,iVar1 + 1);
    sqlite3VdbeJumpHere(p_00,iVar4);
    sqlite3VdbeJumpHere(p_00,iVar5);
    sqlite3VdbeAddOp3(p_00,0x1f,iVar1 + -1,2,p3);
    sqlite3VdbeAddOp3(p_00,0x39,0,p3,iVar1 + 1);
    sqlite3VdbeChangeP5(p_00,'\b');
    sqlite3VdbeAddOp0(p_00,0x2d);
    sqlite3ReleaseTempReg(pParse,p3);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AutoincrementEnd(Parse *pParse){
  AutoincInfo *p;
  Vdbe *v = pParse->pVdbe;
  sqlite3 *db = pParse->db;

  assert( v );
  for(p = pParse->pAinc; p; p = p->pNext){
    Db *pDb = &db->aDb[p->iDb];
    int j1, j2, j3, j4, j5;
    int iRec;
    int memId = p->regCtr;

    iRec = sqlite3GetTempReg(pParse);
    assert( sqlite3SchemaMutexHeld(db, 0, pDb->pSchema) );
    sqlite3OpenTable(pParse, 0, p->iDb, pDb->pSchema->pSeqTab, OP_OpenWrite);
    j1 = sqlite3VdbeAddOp1(v, OP_NotNull, memId+1);
    j2 = sqlite3VdbeAddOp0(v, OP_Rewind);
    j3 = sqlite3VdbeAddOp3(v, OP_Column, 0, 0, iRec);
    j4 = sqlite3VdbeAddOp3(v, OP_Eq, memId-1, 0, iRec);
    sqlite3VdbeAddOp2(v, OP_Next, 0, j3);
    sqlite3VdbeJumpHere(v, j2);
    sqlite3VdbeAddOp2(v, OP_NewRowid, 0, memId+1);
    j5 = sqlite3VdbeAddOp0(v, OP_Goto);
    sqlite3VdbeJumpHere(v, j4);
    sqlite3VdbeAddOp2(v, OP_Rowid, 0, memId+1);
    sqlite3VdbeJumpHere(v, j1);
    sqlite3VdbeJumpHere(v, j5);
    sqlite3VdbeAddOp3(v, OP_MakeRecord, memId-1, 2, iRec);
    sqlite3VdbeAddOp3(v, OP_Insert, 0, iRec, memId+1);
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
    sqlite3VdbeAddOp0(v, OP_Close);
    sqlite3ReleaseTempReg(pParse, iRec);
  }
}